

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJsonObjects.cxx
# Opt level: O3

Value * DumpTarget(Value *__return_storage_ptr__,cmGeneratorTarget *target,string *config)

{
  _Rb_tree_node_base *__k;
  _Rb_tree_header *p_Var1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  cmSourceFile *this;
  string *psVar4;
  size_type sVar5;
  pointer ppcVar6;
  ValueHolder VVar7;
  undefined1 uVar8;
  pointer ppcVar9;
  bool bVar10;
  int iVar11;
  cmLocalGenerator *pcVar12;
  char *pcVar13;
  Value *pVVar14;
  Value *extraout_RAX;
  string *psVar15;
  cmInstallTargetGenerator *this_00;
  OutputInfo *pOVar16;
  mapped_type *pmVar17;
  _Base_ptr p_Var18;
  long *plVar19;
  mapped_type *this_01;
  long *plVar20;
  size_type *psVar21;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in;
  string *value;
  pointer ppcVar22;
  pointer ppcVar23;
  string *psVar24;
  _Base_ptr *pp_Var25;
  string *i;
  _Alloc_hider _Var26;
  pointer pbVar27;
  pointer pbVar28;
  undefined8 uVar29;
  const_iterator cVar30;
  const_iterator cVar31;
  string dest;
  __node_base_ptr p_Stack_660;
  string installPath;
  vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> targetGenerators;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  Value installPaths;
  _Alloc_hider local_5a0;
  cmOutputConverter *local_598;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_590;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_580;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  vStack_568;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
  languageDataMap;
  string COMPILE_OPTIONS;
  string linkPath;
  string COMPILE_DEFINITIONS;
  string installPrefix;
  _Alloc_hider local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  _Alloc_hider local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450;
  ValueHolder local_440 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  TargetType local_414;
  string INCLUDE_DIRECTORIES;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string defPropName;
  Value ttl;
  string local_378;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> files;
  string local_340;
  string typeName;
  Value sourceGroupsValue;
  Value local_2d8;
  Value local_2b0;
  Value local_288;
  Value local_260;
  Value local_238;
  Value local_210;
  Value local_1e8;
  Value local_1c0;
  Value local_198;
  Value local_170;
  Value local_148;
  Value local_120;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  pcVar12 = cmGeneratorTarget::GetLocalGenerator(target);
  local_414 = cmGeneratorTarget::GetType(target);
  pcVar13 = cmState::GetTargetTypeName(local_414);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&typeName,pcVar13,(allocator<char> *)&installPaths);
  Json::Value::Value(&ttl,arrayValue);
  Json::Value::Value(&installPaths,"EXECUTABLE");
  Json::Value::append(&ttl,&installPaths);
  Json::Value::~Value(&installPaths);
  Json::Value::Value(&installPaths,"STATIC_LIBRARY");
  Json::Value::append(&ttl,&installPaths);
  Json::Value::~Value(&installPaths);
  Json::Value::Value(&installPaths,"SHARED_LIBRARY");
  Json::Value::append(&ttl,&installPaths);
  Json::Value::~Value(&installPaths);
  Json::Value::Value(&installPaths,"MODULE_LIBRARY");
  Json::Value::append(&ttl,&installPaths);
  Json::Value::~Value(&installPaths);
  Json::Value::Value(&installPaths,"OBJECT_LIBRARY");
  Json::Value::append(&ttl,&installPaths);
  Json::Value::~Value(&installPaths);
  Json::Value::Value(&installPaths,"UTILITY");
  Json::Value::append(&ttl,&installPaths);
  Json::Value::~Value(&installPaths);
  Json::Value::Value(&installPaths,"INTERFACE_LIBRARY");
  Json::Value::append(&ttl,&installPaths);
  Json::Value::~Value(&installPaths);
  bVar10 = Json::Value::isNull(&ttl);
  if (!bVar10) {
    cVar30 = Json::Value::begin(&ttl);
    cVar31 = Json::Value::end(&ttl);
    targetGenerators.super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&targetGenerators.
                   super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&targetGenerators,typeName._M_dataplus._M_p,
               typeName._M_dataplus._M_p + typeName._M_string_length);
    languageDataMap._M_t._M_impl._0_8_ =
         &languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&languageDataMap,
               targetGenerators.
               super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (long)targetGenerators.
                     super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish +
               (long)targetGenerators.
                     super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    COMPILE_DEFINITIONS._M_string_length =
         CONCAT71(COMPILE_DEFINITIONS._M_string_length._1_7_,cVar31.super_ValueIteratorBase.isNull_)
    ;
    languages._M_t._M_impl._0_8_ = &languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
    ;
    COMPILE_DEFINITIONS._M_dataplus._M_p =
         (pointer)cVar31.super_ValueIteratorBase.current_._M_node._M_node;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&languages,languageDataMap._M_t._M_impl._0_8_,
               languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ +
               languageDataMap._M_t._M_impl._0_8_);
    installPath._M_dataplus._M_p = (pointer)&installPath.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&installPath,languages._M_t._M_impl._0_8_,
               languages._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ +
               languages._M_t._M_impl._0_8_);
    installPaths.value_.string_ = (char *)&installPaths.comments_;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&installPaths,installPath._M_dataplus._M_p,
               installPath._M_dataplus._M_p + installPath._M_string_length);
    dest._M_dataplus._M_p = (pointer)&dest.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&dest,installPaths.value_.int_,
               installPaths.value_.string_ + installPaths._8_8_);
    if (installPaths.value_ != &installPaths.comments_) {
      operator_delete(installPaths.value_.string_,
                      (ulong)((long)&(installPaths.comments_)->comment_ + 1));
    }
    installPrefix._M_dataplus._M_p = (pointer)&installPrefix.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&installPrefix,dest._M_dataplus._M_p,
               dest._M_dataplus._M_p + dest._M_string_length);
    COMPILE_OPTIONS._M_string_length =
         CONCAT71(COMPILE_OPTIONS._M_string_length._1_7_,cVar30.super_ValueIteratorBase.isNull_);
    INCLUDE_DIRECTORIES._M_string_length =
         CONCAT71(INCLUDE_DIRECTORIES._M_string_length._1_7_,cVar31.super_ValueIteratorBase.isNull_)
    ;
    COMPILE_OPTIONS._M_dataplus._M_p =
         (pointer)cVar30.super_ValueIteratorBase.current_._M_node._M_node;
    INCLUDE_DIRECTORIES._M_dataplus._M_p =
         (pointer)cVar31.super_ValueIteratorBase.current_._M_node._M_node;
    bVar10 = Json::ValueIteratorBase::isEqual
                       ((ValueIteratorBase *)&COMPILE_OPTIONS,(SelfType *)&INCLUDE_DIRECTORIES);
    if (!bVar10) {
      do {
        linkPath._M_dataplus = COMPILE_OPTIONS._M_dataplus;
        linkPath._M_string_length =
             CONCAT71(linkPath._M_string_length._1_7_,(undefined1)COMPILE_OPTIONS._M_string_length);
        pVVar14 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&linkPath);
        Json::Value::asString_abi_cxx11_((string *)&installPaths,pVVar14);
        VVar7 = installPaths.value_;
        if (installPaths._8_8_ == installPrefix._M_string_length) {
          if (installPaths._8_8_ == 0) {
            bVar10 = true;
          }
          else {
            iVar11 = bcmp(installPaths.value_.string_,installPrefix._M_dataplus._M_p,
                          installPaths._8_8_);
            bVar10 = iVar11 == 0;
          }
        }
        else {
          bVar10 = false;
        }
        if (VVar7 != &installPaths.comments_) {
          operator_delete(VVar7.string_,(ulong)((long)&(installPaths.comments_)->comment_ + 1));
        }
        if (bVar10) break;
        Json::ValueIteratorBase::increment((ValueIteratorBase *)&COMPILE_OPTIONS);
        bVar10 = Json::ValueIteratorBase::isEqual
                           ((ValueIteratorBase *)&COMPILE_OPTIONS,(SelfType *)&INCLUDE_DIRECTORIES);
      } while (!bVar10);
    }
    _Var26._M_p = COMPILE_OPTIONS._M_dataplus._M_p;
    uVar8 = (undefined1)COMPILE_OPTIONS._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)installPrefix._M_dataplus._M_p != &installPrefix.field_2) {
      operator_delete(installPrefix._M_dataplus._M_p,installPrefix.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dest._M_dataplus._M_p != &dest.field_2) {
      operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)installPath._M_dataplus._M_p != &installPath.field_2) {
      operator_delete(installPath._M_dataplus._M_p,installPath.field_2._M_allocated_capacity + 1);
    }
    defPropName._M_dataplus = _Var26;
    defPropName._M_string_length = CONCAT71(defPropName._M_string_length._1_7_,uVar8);
    bVar10 = Json::ValueIteratorBase::isEqual
                       ((ValueIteratorBase *)&COMPILE_DEFINITIONS,(SelfType *)&defPropName);
    if ((_Base_ptr *)languages._M_t._M_impl._0_8_ !=
        &languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)languages._M_t._M_impl._0_8_,
                      (ulong)((long)&(languages._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    if ((_Base_ptr *)languageDataMap._M_t._M_impl._0_8_ !=
        &languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)languageDataMap._M_t._M_impl._0_8_,
                      (ulong)((long)&(languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    if (targetGenerators.
        super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pointer)&targetGenerators.
                  super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(targetGenerators.
                      super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      CONCAT71(targetGenerators.
                               super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                               targetGenerators.
                               super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
    }
    if ((!bVar10) && (bVar10 = cmGeneratorTarget::IsImported(target), !bVar10)) {
      Json::Value::Value(__return_storage_ptr__,objectValue);
      psVar15 = cmGeneratorTarget::GetName_abi_cxx11_(target);
      Json::Value::Value(&local_58,psVar15);
      pVVar14 = Json::Value::operator[](__return_storage_ptr__,&kNAME_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar14,&local_58);
      Json::Value::~Value(&local_58);
      bVar10 = cmTarget::GetIsGeneratorProvided(target->Target);
      Json::Value::Value(&local_80,bVar10);
      pVVar14 = Json::Value::operator[]
                          (__return_storage_ptr__,&kIS_GENERATOR_PROVIDED_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar14,&local_80);
      Json::Value::~Value(&local_80);
      Json::Value::Value(&local_a8,&typeName);
      pVVar14 = Json::Value::operator[](__return_storage_ptr__,&kTYPE_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar14,&local_a8);
      Json::Value::~Value(&local_a8);
      psVar15 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_(pcVar12);
      Json::Value::Value(&local_d0,psVar15);
      pVVar14 = Json::Value::operator[](__return_storage_ptr__,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar14,&local_d0);
      Json::Value::~Value(&local_d0);
      psVar15 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar12);
      Json::Value::Value(&local_f8,psVar15);
      pVVar14 = Json::Value::operator[](__return_storage_ptr__,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar14,&local_f8);
      Json::Value::~Value(&local_f8);
      if (local_414 != INTERFACE_LIBRARY) {
        cmGeneratorTarget::GetFullName((string *)&installPaths,target,config,RuntimeBinaryArtifact);
        Json::Value::Value(&local_120,(string *)&installPaths);
        pVVar14 = Json::Value::operator[](__return_storage_ptr__,&kFULL_NAME_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar14,&local_120);
        Json::Value::~Value(&local_120);
        if (installPaths.value_ != &installPaths.comments_) {
          operator_delete(installPaths.value_.string_,
                          (ulong)((long)&(installPaths.comments_)->comment_ + 1));
        }
        bVar10 = cmTarget::GetHaveInstallRule(target->Target);
        if (bVar10) {
          Json::Value::Value(&local_148,true);
          pVVar14 = Json::Value::operator[](__return_storage_ptr__,&kHAS_INSTALL_RULE_abi_cxx11_);
          Json::Value::operator=(pVVar14,&local_148);
          Json::Value::~Value(&local_148);
          Json::Value::Value(&installPaths,arrayValue);
          std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::vector
                    (&targetGenerators,&target->Makefile->InstallGenerators);
          ppcVar6 = targetGenerators.
                    super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          if (targetGenerators.
              super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              targetGenerators.
              super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            ppcVar23 = targetGenerators.
                       super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            do {
              if (((*ppcVar23 != (cmInstallGenerator *)0x0) &&
                  (this_00 = (cmInstallTargetGenerator *)
                             __dynamic_cast(*ppcVar23,&cmInstallGenerator::typeinfo,
                                            &cmInstallTargetGenerator::typeinfo),
                  this_00 != (cmInstallTargetGenerator *)0x0)) &&
                 (this_00->Target->Target == target->Target)) {
                cmInstallTargetGenerator::GetDestination(&dest,this_00,config);
                installPath._M_dataplus._M_p = (pointer)&installPath.field_2;
                installPath._M_string_length = 0;
                installPath.field_2._M_allocated_capacity =
                     installPath.field_2._M_allocated_capacity & 0xffffffffffffff00;
                if ((dest._M_string_length == 0) ||
                   (bVar10 = cmsys::SystemTools::FileIsFullPath(&dest), !bVar10)) {
                  pcVar2 = target->Makefile;
                  languages._M_t._M_impl._0_8_ =
                       &languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&languages,"CMAKE_INSTALL_PREFIX","");
                  psVar15 = cmMakefile::GetSafeDefinition(pcVar2,(string *)&languages);
                  installPrefix._M_dataplus._M_p = (pointer)&installPrefix.field_2;
                  pcVar3 = (psVar15->_M_dataplus)._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&installPrefix,pcVar3,pcVar3 + psVar15->_M_string_length);
                  if ((_Base_ptr *)languages._M_t._M_impl._0_8_ !=
                      &languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                    operator_delete((void *)languages._M_t._M_impl._0_8_,
                                    (ulong)((long)&(languages._M_t._M_impl.super__Rb_tree_header.
                                                    _M_header._M_parent)->_M_color + 1));
                  }
                  languageDataMap._M_t._M_impl._0_8_ =
                       &languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&languageDataMap,installPrefix._M_dataplus._M_p,
                             installPrefix._M_dataplus._M_p + installPrefix._M_string_length);
                  std::__cxx11::string::_M_replace_aux
                            ((ulong)&languageDataMap,
                             languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,0,
                             '\x01');
                  plVar19 = (long *)std::__cxx11::string::_M_append
                                              ((char *)&languageDataMap,(ulong)dest._M_dataplus._M_p
                                              );
                  pp_Var25 = &languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                  plVar20 = plVar19 + 2;
                  if ((long *)*plVar19 == plVar20) {
                    languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                         (_Base_ptr)*plVar20;
                    languages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                         (_Base_ptr)plVar19[3];
                    languages._M_t._M_impl._0_8_ = pp_Var25;
                  }
                  else {
                    languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                         (_Base_ptr)*plVar20;
                    languages._M_t._M_impl._0_8_ = (long *)*plVar19;
                  }
                  languages._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar19[1];
                  *plVar19 = (long)plVar20;
                  plVar19[1] = 0;
                  *(undefined1 *)(plVar19 + 2) = 0;
                  std::__cxx11::string::operator=((string *)&installPath,(string *)&languages);
                  if ((_Base_ptr *)languages._M_t._M_impl._0_8_ != pp_Var25) {
                    operator_delete((void *)languages._M_t._M_impl._0_8_,
                                    (ulong)((long)&(languages._M_t._M_impl.super__Rb_tree_header.
                                                    _M_header._M_parent)->_M_color + 1));
                  }
                  if ((_Base_ptr *)languageDataMap._M_t._M_impl._0_8_ !=
                      &languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                    operator_delete((void *)languageDataMap._M_t._M_impl._0_8_,
                                    (ulong)((long)&(languageDataMap._M_t._M_impl.
                                                    super__Rb_tree_header._M_header._M_parent)->
                                                   _M_color + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)installPrefix._M_dataplus._M_p != &installPrefix.field_2) {
                    operator_delete(installPrefix._M_dataplus._M_p,
                                    installPrefix.field_2._M_allocated_capacity + 1);
                  }
                }
                else {
                  std::__cxx11::string::_M_assign((string *)&installPath);
                }
                Json::Value::Value((Value *)&installPrefix,&installPath);
                Json::Value::append(&installPaths,(Value *)&installPrefix);
                Json::Value::~Value((Value *)&installPrefix);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)installPath._M_dataplus._M_p != &installPath.field_2) {
                  operator_delete(installPath._M_dataplus._M_p,
                                  installPath.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)dest._M_dataplus._M_p != &dest.field_2) {
                  operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
                }
              }
              ppcVar23 = ppcVar23 + 1;
            } while (ppcVar23 != ppcVar6);
          }
          Json::Value::Value(&local_170,&installPaths);
          pVVar14 = Json::Value::operator[](__return_storage_ptr__,&kINSTALL_PATHS_abi_cxx11_);
          Json::Value::operator=(pVVar14,&local_170);
          Json::Value::~Value(&local_170);
          if (targetGenerators.
              super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(targetGenerators.
                            super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            CONCAT71(targetGenerators.
                                     super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                     targetGenerators.
                                     super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                            (long)targetGenerators.
                                  super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          Json::Value::~Value(&installPaths);
        }
        pp_Var25 = &languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        bVar10 = cmGeneratorTarget::HaveWellDefinedOutputFiles(target);
        if (bVar10) {
          Json::Value::Value((Value *)&installPrefix,arrayValue);
          cmGeneratorTarget::GetFullPath(&dest,target,config,RuntimeBinaryArtifact,false);
          Json::Value::Value(&installPaths,&dest);
          Json::Value::append((Value *)&installPrefix,&installPaths);
          Json::Value::~Value(&installPaths);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dest._M_dataplus._M_p != &dest.field_2) {
            operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
          }
          bVar10 = cmGeneratorTarget::IsDLLPlatform(target);
          if (bVar10) {
            cmGeneratorTarget::GetFullPath(&dest,target,config,ImportLibraryArtifact,false);
            Json::Value::Value(&installPaths,&dest);
            Json::Value::append((Value *)&installPrefix,&installPaths);
            Json::Value::~Value(&installPaths);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)dest._M_dataplus._M_p != &dest.field_2) {
              operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
            }
            pOVar16 = cmGeneratorTarget::GetOutputInfo(target,config);
            if ((pOVar16 != (OutputInfo *)0x0) && ((pOVar16->PdbDir)._M_string_length != 0)) {
              std::operator+(&installPath,&pOVar16->PdbDir,'/');
              cmGeneratorTarget::GetPDBName((string *)&languages,target,config);
              std::operator+(&dest,&installPath,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &languages);
              Json::Value::Value(&installPaths,&dest);
              Json::Value::append((Value *)&installPrefix,&installPaths);
              Json::Value::~Value(&installPaths);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)dest._M_dataplus._M_p != &dest.field_2) {
                operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)languages._M_t._M_impl._0_8_ != pp_Var25) {
                operator_delete((void *)languages._M_t._M_impl._0_8_,
                                (ulong)((long)&(languages._M_t._M_impl.super__Rb_tree_header.
                                                _M_header._M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)installPath._M_dataplus._M_p != &installPath.field_2) {
                operator_delete(installPath._M_dataplus._M_p,
                                installPath.field_2._M_allocated_capacity + 1);
              }
            }
          }
          Json::Value::Value(&local_198,(Value *)&installPrefix);
          pVVar14 = Json::Value::operator[](__return_storage_ptr__,&kARTIFACTS_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar14,&local_198);
          Json::Value::~Value(&local_198);
          cmGeneratorTarget::GetLinkerLanguage((string *)&installPaths,target,config);
          Json::Value::Value(&local_1c0,(string *)&installPaths);
          pVVar14 = Json::Value::operator[](__return_storage_ptr__,&kLINKER_LANGUAGE_KEY_abi_cxx11_)
          ;
          Json::Value::operator=(pVVar14,&local_1c0);
          Json::Value::~Value(&local_1c0);
          if (installPaths.value_ != &installPaths.comments_) {
            operator_delete(installPaths.value_.string_,
                            (ulong)((long)&(installPaths.comments_)->comment_ + 1));
          }
          installPath._M_dataplus._M_p = (pointer)&installPath.field_2;
          installPath._M_string_length = 0;
          installPath.field_2._M_allocated_capacity =
               installPath.field_2._M_allocated_capacity & 0xffffffffffffff00;
          languages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          languages._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)
               ((ulong)languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
               0xffffffffffffff00);
          languageDataMap._M_t._M_impl._0_8_ =
               &languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)
               ((ulong)languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
               0xffffffffffffff00);
          targetGenerators.
          super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&targetGenerators.
                         super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          targetGenerators.
          super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          targetGenerators.
          super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          linkPath._M_string_length = 0;
          linkPath.field_2._M_local_buf[0] = '\0';
          languages._M_t._M_impl._0_8_ = pp_Var25;
          linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
          cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&COMPILE_OPTIONS,pcVar12);
          cmStateSnapshot::GetDirectory
                    ((cmStateDirectory *)&dest,(cmStateSnapshot *)&COMPILE_OPTIONS);
          cmLinkLineComputer::cmLinkLineComputer
                    ((cmLinkLineComputer *)&installPaths,&pcVar12->super_cmOutputConverter,
                     (cmStateDirectory *)&dest);
          cmLocalGenerator::GetTargetFlags
                    (pcVar12,(cmLinkLineComputer *)&installPaths,config,&installPath,
                     (string *)&languageDataMap,(string *)&languages,(string *)&targetGenerators,
                     &linkPath,target);
          cmSystemTools::TrimWhitespace(&dest,&installPath);
          std::__cxx11::string::operator=((string *)&installPath,(string *)&dest);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dest._M_dataplus._M_p != &dest.field_2) {
            operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
          }
          cmSystemTools::TrimWhitespace(&dest,(string *)&languages);
          std::__cxx11::string::operator=((string *)&languages,(string *)&dest);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dest._M_dataplus._M_p != &dest.field_2) {
            operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
          }
          cmSystemTools::TrimWhitespace(&dest,(string *)&languageDataMap);
          std::__cxx11::string::operator=((string *)&languageDataMap,(string *)&dest);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dest._M_dataplus._M_p != &dest.field_2) {
            operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
          }
          cmSystemTools::TrimWhitespace(&dest,(string *)&targetGenerators);
          std::__cxx11::string::operator=((string *)&targetGenerators,(string *)&dest);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dest._M_dataplus._M_p != &dest.field_2) {
            operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
          }
          cmSystemTools::TrimWhitespace(&dest,&linkPath);
          std::__cxx11::string::operator=((string *)&linkPath,(string *)&dest);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dest._M_dataplus._M_p != &dest.field_2) {
            operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
          }
          cmSystemTools::TrimWhitespace(&dest,&installPath);
          sVar5 = dest._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dest._M_dataplus._M_p != &dest.field_2) {
            operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
          }
          if (sVar5 != 0) {
            Json::Value::Value(&local_1e8,&installPath);
            pVVar14 = Json::Value::operator[]
                                (__return_storage_ptr__,&kLINK_LIBRARIES_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar14,&local_1e8);
            Json::Value::~Value(&local_1e8);
          }
          cmSystemTools::TrimWhitespace(&dest,(string *)&languages);
          sVar5 = dest._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dest._M_dataplus._M_p != &dest.field_2) {
            operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
          }
          if (sVar5 != 0) {
            Json::Value::Value(&local_210,(string *)&languages);
            pVVar14 = Json::Value::operator[](__return_storage_ptr__,&kLINK_FLAGS_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar14,&local_210);
            Json::Value::~Value(&local_210);
          }
          cmSystemTools::TrimWhitespace(&dest,(string *)&languageDataMap);
          sVar5 = dest._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dest._M_dataplus._M_p != &dest.field_2) {
            operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
          }
          if (sVar5 != 0) {
            Json::Value::Value(&local_238,(string *)&languageDataMap);
            pVVar14 = Json::Value::operator[]
                                (__return_storage_ptr__,&kLINK_LANGUAGE_FLAGS_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar14,&local_238);
            Json::Value::~Value(&local_238);
          }
          if (targetGenerators.
              super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>.
              _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
            Json::Value::Value(&local_260,(string *)&targetGenerators);
            pVVar14 = Json::Value::operator[]
                                (__return_storage_ptr__,&kFRAMEWORK_PATH_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar14,&local_260);
            Json::Value::~Value(&local_260);
          }
          if (linkPath._M_string_length != 0) {
            Json::Value::Value(&local_288,&linkPath);
            pVVar14 = Json::Value::operator[](__return_storage_ptr__,&kLINK_PATH_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar14,&local_288);
            Json::Value::~Value(&local_288);
          }
          pcVar2 = pcVar12->Makefile;
          COMPILE_OPTIONS._M_dataplus._M_p = (pointer)&COMPILE_OPTIONS.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&COMPILE_OPTIONS,"CMAKE_SYSROOT","");
          psVar15 = cmMakefile::GetSafeDefinition(pcVar2,&COMPILE_OPTIONS);
          dest._M_dataplus._M_p = (pointer)&dest.field_2;
          pcVar3 = (psVar15->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&dest,pcVar3,pcVar3 + psVar15->_M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)COMPILE_OPTIONS._M_dataplus._M_p != &COMPILE_OPTIONS.field_2) {
            operator_delete(COMPILE_OPTIONS._M_dataplus._M_p,
                            CONCAT17(COMPILE_OPTIONS.field_2._M_local_buf[7],
                                     COMPILE_OPTIONS.field_2._M_allocated_capacity._0_7_) + 1);
          }
          if (dest._M_string_length != 0) {
            Json::Value::Value(&local_2b0,&dest);
            pVVar14 = Json::Value::operator[](__return_storage_ptr__,&kSYSROOT_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar14,&local_2b0);
            Json::Value::~Value(&local_2b0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dest._M_dataplus._M_p != &dest.field_2) {
            operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
          }
          cmLinkLineComputer::~cmLinkLineComputer((cmLinkLineComputer *)&installPaths);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)linkPath._M_dataplus._M_p != &linkPath.field_2) {
            operator_delete(linkPath._M_dataplus._M_p,
                            CONCAT35(linkPath.field_2._M_allocated_capacity._5_3_,
                                     CONCAT41(linkPath.field_2._M_allocated_capacity._1_4_,
                                              linkPath.field_2._M_local_buf[0])) + 1);
          }
          if (targetGenerators.
              super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              (pointer)&targetGenerators.
                        super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(targetGenerators.
                            super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            CONCAT71(targetGenerators.
                                     super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                     targetGenerators.
                                     super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
          }
          if ((_Base_ptr *)languageDataMap._M_t._M_impl._0_8_ !=
              &languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
            operator_delete((void *)languageDataMap._M_t._M_impl._0_8_,
                            (ulong)((long)&(languageDataMap._M_t._M_impl.super__Rb_tree_header.
                                            _M_header._M_parent)->_M_color + 1));
          }
          if ((_Base_ptr *)languages._M_t._M_impl._0_8_ != pp_Var25) {
            operator_delete((void *)languages._M_t._M_impl._0_8_,
                            (ulong)((long)&(languages._M_t._M_impl.super__Rb_tree_header._M_header.
                                           _M_parent)->_M_color + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)installPath._M_dataplus._M_p != &installPath.field_2) {
            operator_delete(installPath._M_dataplus._M_p,
                            installPath.field_2._M_allocated_capacity + 1);
          }
          Json::Value::~Value((Value *)&installPrefix);
        }
        p_Var1 = &languages._M_t._M_impl.super__Rb_tree_header;
        languages._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             languages._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        languages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        languages._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        languages._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
        cmGeneratorTarget::GetLanguages(target,&languages,config);
        languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header;
        languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000
        ;
        languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        languageDataMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((_Rb_tree_header *)languages._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
            p_Var1) {
          p_Var18 = languages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            __k = p_Var18 + 1;
            pmVar17 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
                      ::operator[](&languageDataMap,(key_type *)__k);
            std::__cxx11::string::_M_assign((string *)&pmVar17->Language);
            cmLocalGenerator::GetTargetCompileFlags
                      (pcVar12,target,config,(string *)__k,&pmVar17->Flags);
            installPaths._8_8_ = installPaths._8_8_ & 0xffffffff00000000;
            installPaths.comments_ = (CommentInfo *)0x0;
            installPaths.start_ = (ptrdiff_t)&installPaths.field_0x8;
            local_5a0._M_p = (pointer)0x0;
            installPaths.limit_ = installPaths.start_;
            cmLocalGenerator::GetTargetDefines
                      (pcVar12,target,config,(string *)__k,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&installPaths);
            LanguageData::SetDefines
                      (pmVar17,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&installPaths);
            installPrefix._M_dataplus._M_p = (pointer)0x0;
            installPrefix._M_string_length = 0;
            installPrefix.field_2._M_allocated_capacity = 0;
            cmLocalGenerator::GetIncludeDirectories
                      (pcVar12,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&installPrefix,target,(string *)__k,config);
            sVar5 = installPrefix._M_string_length;
            if (installPrefix._M_dataplus._M_p != (pointer)installPrefix._M_string_length) {
              _Var26 = installPrefix._M_dataplus;
              do {
                bVar10 = cmGeneratorTarget::IsSystemIncludeDirectory
                                   (target,(string *)_Var26._M_p,config,(string *)__k);
                dest._M_dataplus._M_p._0_1_ = bVar10;
                std::
                vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
                ::emplace_back<std::__cxx11::string_const&,bool>
                          ((vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
                            *)&pmVar17->IncludePathList,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           _Var26._M_p,(bool *)&dest);
                _Var26._M_p = _Var26._M_p + 0x20;
              } while (_Var26._M_p != (pointer)sVar5);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&installPrefix);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&installPaths);
            p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
          } while ((_Rb_tree_header *)p_Var18 != &languages._M_t._M_impl.super__Rb_tree_header);
        }
        files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cmGeneratorTarget::GetSourceFiles(target,&files,config);
        ppcVar9 = files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        dest._M_dataplus._M_p = (pointer)&p_Stack_660;
        dest._M_string_length = 1;
        dest.field_2._M_allocated_capacity = 0;
        dest.field_2._8_8_ = 0;
        p_Stack_660 = (__node_base_ptr)0x0;
        for (ppcVar22 = files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                        _M_impl.super__Vector_impl_data._M_start; ppcVar22 != ppcVar9;
            ppcVar22 = ppcVar22 + 1) {
          this = *ppcVar22;
          installPaths.value_.uint_ = installPaths.value_.uint_ & 0xffffffffffffff00;
          installPaths._8_8_ = &installPaths.start_;
          installPaths.comments_ = (CommentInfo *)0x0;
          installPaths.start_ = installPaths.start_ & 0xffffffffffffff00;
          local_5a0._M_p = (pointer)&local_590;
          local_598 = (cmOutputConverter *)0x0;
          local_590._M_local_buf[0] = false;
          vStack_568.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_568.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_580.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vStack_568.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_580.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_580.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          cmSourceFile::GetLanguage_abi_cxx11_(&installPrefix,this);
          std::__cxx11::string::operator=
                    ((string *)&installPaths.field_0x8,(string *)&installPrefix);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)installPrefix._M_dataplus._M_p != &installPrefix.field_2) {
            operator_delete(installPrefix._M_dataplus._M_p,
                            installPrefix.field_2._M_allocated_capacity + 1);
          }
          if (installPaths.comments_ != (CommentInfo *)0x0) {
            pmVar17 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
                      ::at(&languageDataMap,(key_type *)&installPaths.field_0x8);
            pcVar12 = cmGeneratorTarget::GetLocalGenerator(target);
            local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
            pcVar3 = (config->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_378,pcVar3,pcVar3 + config->_M_string_length);
            local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_340,installPaths._8_8_,
                       (long)&(installPaths.comments_)->comment_ + installPaths._8_8_);
            cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
                      ((cmGeneratorExpressionInterpreter *)&installPrefix,pcVar12,&local_378,target,
                       &local_340);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_340._M_dataplus._M_p != &local_340.field_2) {
              operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._M_dataplus._M_p != &local_378.field_2) {
              operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1
                             );
            }
            targetGenerators.
            super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)&targetGenerators.
                           super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pcVar3 = (pmVar17->Flags)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&targetGenerators,pcVar3,pcVar3 + (pmVar17->Flags)._M_string_length
                      );
            linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
            linkPath.field_2._8_5_ = 0x5347414c46;
            linkPath.field_2._M_local_buf[0] = 'C';
            linkPath.field_2._M_allocated_capacity._1_4_ = 0x49504d4f;
            linkPath.field_2._M_allocated_capacity._5_3_ = 0x5f454c;
            linkPath._M_string_length = 0xd;
            linkPath.field_2._M_local_buf[0xd] = '\0';
            pcVar13 = cmSourceFile::GetProperty(this,&linkPath);
            if (pcVar13 != (char *)0x0) {
              psVar15 = cmGeneratorExpressionInterpreter::Evaluate
                                  ((cmGeneratorExpressionInterpreter *)&installPrefix,pcVar13,
                                   &linkPath);
              (*pcVar12->_vptr_cmLocalGenerator[6])(pcVar12,&targetGenerators,psVar15);
            }
            COMPILE_OPTIONS._M_dataplus._M_p = (pointer)&COMPILE_OPTIONS.field_2;
            COMPILE_OPTIONS.field_2._8_7_ = 0x534e4f4954504f;
            COMPILE_OPTIONS.field_2._M_allocated_capacity._0_7_ = 0x454c49504d4f43;
            COMPILE_OPTIONS.field_2._M_local_buf[7] = '_';
            COMPILE_OPTIONS._M_string_length = 0xf;
            COMPILE_OPTIONS.field_2._M_local_buf[0xf] = '\0';
            pcVar13 = cmSourceFile::GetProperty(this,&COMPILE_OPTIONS);
            if (pcVar13 != (char *)0x0) {
              psVar15 = cmGeneratorExpressionInterpreter::Evaluate
                                  ((cmGeneratorExpressionInterpreter *)&installPrefix,pcVar13,
                                   &COMPILE_OPTIONS);
              cmLocalGenerator::AppendCompileOptions
                        (pcVar12,(string *)&targetGenerators,(psVar15->_M_dataplus)._M_p,(char *)0x0
                        );
            }
            std::__cxx11::string::_M_assign((string *)&local_5a0);
            includes.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            includes.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            includes.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            INCLUDE_DIRECTORIES._M_dataplus._M_p = (pointer)&INCLUDE_DIRECTORIES.field_2;
            installPath._M_dataplus._M_p = (pointer)0x13;
            INCLUDE_DIRECTORIES._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create
                                    ((ulong *)&INCLUDE_DIRECTORIES,(ulong)&installPath);
            INCLUDE_DIRECTORIES.field_2._M_allocated_capacity =
                 (size_type)installPath._M_dataplus._M_p;
            builtin_strncpy(INCLUDE_DIRECTORIES._M_dataplus._M_p,"INCLUDE_DIRECTORIES",0x13);
            INCLUDE_DIRECTORIES._M_string_length = (size_type)installPath._M_dataplus._M_p;
            INCLUDE_DIRECTORIES._M_dataplus._M_p[(long)installPath._M_dataplus._M_p] = '\0';
            pcVar13 = cmSourceFile::GetProperty(this,&INCLUDE_DIRECTORIES);
            if (pcVar13 != (char *)0x0) {
              psVar15 = cmGeneratorExpressionInterpreter::Evaluate
                                  ((cmGeneratorExpressionInterpreter *)&installPrefix,pcVar13,
                                   &INCLUDE_DIRECTORIES);
              cmLocalGenerator::AppendIncludeDirectories
                        (pcVar12,&includes,(psVar15->_M_dataplus)._M_p,this);
              pbVar28 = includes.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              for (pbVar27 = includes.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start; pbVar27 != pbVar28;
                  pbVar27 = pbVar27 + 1) {
                bVar10 = cmGeneratorTarget::IsSystemIncludeDirectory
                                   (target,pbVar27,config,(string *)&installPaths.field_0x8);
                installPath._M_dataplus._M_p._0_1_ = bVar10;
                std::
                vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
                ::emplace_back<std::__cxx11::string_const&,bool>
                          ((vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
                            *)&vStack_568,pbVar27,(bool *)&installPath);
              }
            }
            std::
            vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
            ::
            _M_range_insert<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,bool>const*,std::vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>>>
                      ((vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
                        *)&vStack_568,
                       vStack_568.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (pmVar17->IncludePathList).
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (pmVar17->IncludePathList).
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            COMPILE_DEFINITIONS._M_dataplus._M_p = (pointer)&COMPILE_DEFINITIONS.field_2;
            installPath._M_dataplus._M_p = (pointer)0x13;
            COMPILE_DEFINITIONS._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create
                                    ((ulong *)&COMPILE_DEFINITIONS,(ulong)&installPath);
            COMPILE_DEFINITIONS.field_2._M_allocated_capacity =
                 (size_type)installPath._M_dataplus._M_p;
            builtin_strncpy(COMPILE_DEFINITIONS._M_dataplus._M_p,"COMPILE_DEFINITIONS",0x13);
            COMPILE_DEFINITIONS._M_string_length = (size_type)installPath._M_dataplus._M_p;
            COMPILE_DEFINITIONS._M_dataplus._M_p[(long)installPath._M_dataplus._M_p] = '\0';
            installPath._M_string_length = installPath._M_string_length & 0xffffffff00000000;
            installPath.field_2._M_allocated_capacity = 0;
            installPath.field_2._8_8_ = &installPath._M_string_length;
            pcVar13 = cmSourceFile::GetProperty(this,&COMPILE_DEFINITIONS);
            if (pcVar13 != (char *)0x0) {
              psVar15 = cmGeneratorExpressionInterpreter::Evaluate
                                  ((cmGeneratorExpressionInterpreter *)&installPrefix,pcVar13,
                                   &COMPILE_DEFINITIONS);
              cmLocalGenerator::AppendDefines
                        (pcVar12,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&installPath,psVar15);
            }
            cmsys::SystemTools::UpperCase((string *)local_440,config);
            plVar19 = (long *)std::__cxx11::string::replace((ulong)local_440,0,(char *)0x0,0x5135d8)
            ;
            defPropName._M_dataplus._M_p = (pointer)&defPropName.field_2;
            psVar21 = (size_type *)(plVar19 + 2);
            if ((size_type *)*plVar19 == psVar21) {
              defPropName.field_2._M_allocated_capacity = *psVar21;
              defPropName.field_2._8_8_ = plVar19[3];
            }
            else {
              defPropName.field_2._M_allocated_capacity = *psVar21;
              defPropName._M_dataplus._M_p = (pointer)*plVar19;
            }
            defPropName._M_string_length = plVar19[1];
            *plVar19 = (long)psVar21;
            plVar19[1] = 0;
            *(undefined1 *)(plVar19 + 2) = 0;
            if (local_440[0] != &local_430) {
              operator_delete(local_440[0].string_,local_430._M_allocated_capacity + 1);
            }
            pcVar13 = cmSourceFile::GetProperty(this,&defPropName);
            if (pcVar13 != (char *)0x0) {
              psVar15 = cmGeneratorExpressionInterpreter::Evaluate
                                  ((cmGeneratorExpressionInterpreter *)&installPrefix,pcVar13,
                                   &COMPILE_DEFINITIONS);
              cmLocalGenerator::AppendDefines
                        (pcVar12,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&installPath,psVar15);
            }
            pbVar27 = (pmVar17->Defines).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            local_440[0].string_ = (char *)&installPath;
            for (pbVar28 = (pmVar17->Defines).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pbVar28 != pbVar27;
                pbVar28 = pbVar28 + 1) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::
              _M_insert_unique_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&installPath,(const_iterator)&installPath._M_string_length,pbVar28,
                         (_Alloc_node *)local_440);
            }
            LanguageData::SetDefines
                      ((LanguageData *)&installPaths,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&installPath);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)defPropName._M_dataplus._M_p != &defPropName.field_2) {
              operator_delete(defPropName._M_dataplus._M_p,
                              defPropName.field_2._M_allocated_capacity + 1);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&installPath);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)COMPILE_DEFINITIONS._M_dataplus._M_p != &COMPILE_DEFINITIONS.field_2) {
              operator_delete(COMPILE_DEFINITIONS._M_dataplus._M_p,
                              COMPILE_DEFINITIONS.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)INCLUDE_DIRECTORIES._M_dataplus._M_p != &INCLUDE_DIRECTORIES.field_2) {
              operator_delete(INCLUDE_DIRECTORIES._M_dataplus._M_p,
                              INCLUDE_DIRECTORIES.field_2._M_allocated_capacity + 1);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&includes);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)COMPILE_OPTIONS._M_dataplus._M_p != &COMPILE_OPTIONS.field_2) {
              operator_delete(COMPILE_OPTIONS._M_dataplus._M_p,
                              CONCAT17(COMPILE_OPTIONS.field_2._M_local_buf[7],
                                       COMPILE_OPTIONS.field_2._M_allocated_capacity._0_7_) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)linkPath._M_dataplus._M_p != &linkPath.field_2) {
              operator_delete(linkPath._M_dataplus._M_p,
                              CONCAT35(linkPath.field_2._M_allocated_capacity._5_3_,
                                       CONCAT41(linkPath.field_2._M_allocated_capacity._1_4_,
                                                linkPath.field_2._M_local_buf[0])) + 1);
            }
            if (targetGenerators.
                super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                (pointer)&targetGenerators.
                          super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(targetGenerators.
                              super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              CONCAT71(targetGenerators.
                                       super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                       targetGenerators.
                                       super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_460._M_p != &local_450) {
              operator_delete(local_460._M_p,local_450._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_488._M_p != &local_478) {
              operator_delete(local_488._M_p,local_478._M_allocated_capacity + 1);
            }
            std::
            unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           *)&installPrefix.field_2._M_allocated_capacity);
            cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&installPrefix);
          }
          installPaths.value_.bool_ = this->IsGenerated;
          this_01 = std::__detail::
                    _Map_base<LanguageData,_std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<LanguageData>,_std::hash<LanguageData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<LanguageData,_std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<LanguageData>,_std::hash<LanguageData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&dest,(key_type *)&installPaths);
          psVar15 = cmSourceFile::GetFullPath(this,(string *)0x0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(this_01,psVar15);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ::~vector(&vStack_568);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_580);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5a0._M_p != &local_590) {
            operator_delete(local_5a0._M_p,
                            CONCAT71(local_590._M_allocated_capacity._1_7_,local_590._M_local_buf[0]
                                    ) + 1);
          }
          if ((ptrdiff_t *)installPaths._8_8_ != &installPaths.start_) {
            operator_delete((void *)installPaths._8_8_,installPaths.start_ + 1);
          }
        }
        psVar15 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(target->Makefile);
        Json::Value::Value(&sourceGroupsValue,arrayValue);
        if (dest.field_2._M_allocated_capacity != 0) {
          uVar29 = dest.field_2._M_allocated_capacity;
          do {
            Json::Value::Value((Value *)local_440,objectValue);
            if (*(long *)(uVar29 + 0x18) != 0) {
              Json::Value::Value(&installPaths,(string *)(uVar29 + 0x10));
              pVVar14 = Json::Value::operator[]((Value *)local_440,&kLANGUAGE_KEY_abi_cxx11_);
              Json::Value::operator=(pVVar14,&installPaths);
              Json::Value::~Value(&installPaths);
              in = extraout_RDX;
              if (*(long *)(uVar29 + 0x38) != 0) {
                Json::Value::Value((Value *)&installPrefix,(string *)(uVar29 + 0x30));
                pVVar14 = Json::Value::operator[]((Value *)local_440,&kCOMPILE_FLAGS_KEY_abi_cxx11_)
                ;
                Json::Value::operator=(pVVar14,(Value *)&installPrefix);
                Json::Value::~Value((Value *)&installPrefix);
                in = extraout_RDX_00;
              }
              if (*(long *)(uVar29 + 0x68) != *(long *)(uVar29 + 0x70)) {
                Json::Value::Value((Value *)&installPath,arrayValue);
                psVar4 = *(string **)(uVar29 + 0x70);
                for (psVar24 = *(string **)(uVar29 + 0x68); psVar24 != psVar4;
                    psVar24 = (string *)&psVar24[1]._M_string_length) {
                  Json::Value::Value((Value *)&targetGenerators,objectValue);
                  Json::Value::Value((Value *)&linkPath,psVar24);
                  pVVar14 = Json::Value::operator[]
                                      ((Value *)&targetGenerators,&kPATH_KEY_abi_cxx11_);
                  Json::Value::operator=(pVVar14,(Value *)&linkPath);
                  Json::Value::~Value((Value *)&linkPath);
                  if (*(char *)&psVar24[1]._M_dataplus._M_p == '\x01') {
                    Json::Value::Value((Value *)&COMPILE_OPTIONS,true);
                    pVVar14 = Json::Value::operator[]
                                        ((Value *)&targetGenerators,&kIS_SYSTEM_KEY_abi_cxx11_);
                    Json::Value::operator=(pVVar14,(Value *)&COMPILE_OPTIONS);
                    Json::Value::~Value((Value *)&COMPILE_OPTIONS);
                  }
                  Json::Value::append((Value *)&installPath,(Value *)&targetGenerators);
                  Json::Value::~Value((Value *)&targetGenerators);
                }
                Json::Value::Value((Value *)&targetGenerators,(Value *)&installPath);
                pVVar14 = Json::Value::operator[]((Value *)local_440,&kINCLUDE_PATH_KEY_abi_cxx11_);
                Json::Value::operator=(pVVar14,(Value *)&targetGenerators);
                Json::Value::~Value((Value *)&targetGenerators);
                Json::Value::~Value((Value *)&installPath);
                in = extraout_RDX_01;
              }
              if (*(long *)(uVar29 + 0x50) != *(long *)(uVar29 + 0x58)) {
                (anonymous_namespace)::
                fromStringList<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((Value *)&installPath,(_anonymous_namespace_ *)(uVar29 + 0x50),in);
                pVVar14 = Json::Value::operator[]((Value *)local_440,&kDEFINES_KEY_abi_cxx11_);
                Json::Value::operator=(pVVar14,(Value *)&installPath);
                Json::Value::~Value((Value *)&installPath);
              }
            }
            Json::Value::Value((Value *)&INCLUDE_DIRECTORIES,SUB81(*(long *)(uVar29 + 8),0));
            pVVar14 = Json::Value::operator[]((Value *)local_440,&kIS_GENERATED_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar14,(Value *)&INCLUDE_DIRECTORIES);
            Json::Value::~Value((Value *)&INCLUDE_DIRECTORIES);
            Json::Value::Value((Value *)&COMPILE_DEFINITIONS,arrayValue);
            psVar4 = *(string **)(uVar29 + 0x88);
            for (psVar24 = *(string **)(uVar29 + 0x80); psVar24 != psVar4; psVar24 = psVar24 + 1) {
              cmSystemTools::RelativePath((string *)&includes,psVar15,psVar24);
              value = (string *)&includes;
              if ((pointer)psVar24->_M_string_length <=
                  includes.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                value = psVar24;
              }
              Json::Value::Value((Value *)&defPropName,value);
              Json::Value::append((Value *)&COMPILE_DEFINITIONS,(Value *)&defPropName);
              Json::Value::~Value((Value *)&defPropName);
              if (includes.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&includes.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(includes.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (ulong)((long)&((includes.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->_M_dataplus)._M_p + 1));
              }
            }
            Json::Value::Value((Value *)&defPropName,(Value *)&COMPILE_DEFINITIONS);
            pVVar14 = Json::Value::operator[]((Value *)local_440,&kSOURCES_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar14,(Value *)&defPropName);
            Json::Value::~Value((Value *)&defPropName);
            Json::Value::~Value((Value *)&COMPILE_DEFINITIONS);
            bVar10 = Json::Value::isNull((Value *)local_440);
            if (!bVar10) {
              Json::Value::append(&sourceGroupsValue,(Value *)local_440);
            }
            Json::Value::~Value((Value *)local_440);
            uVar29 = *(undefined8 *)uVar29;
          } while (uVar29 != 0);
        }
        std::
        _Hashtable<LanguageData,_std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<LanguageData>,_std::hash<LanguageData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<LanguageData,_std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<LanguageData>,_std::hash<LanguageData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&dest);
        if (files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)files.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)files.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        bVar10 = Json::Value::empty(&sourceGroupsValue);
        if (!bVar10) {
          Json::Value::Value(&local_2d8,&sourceGroupsValue);
          pVVar14 = Json::Value::operator[](__return_storage_ptr__,&kFILE_GROUPS_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar14,&local_2d8);
          Json::Value::~Value(&local_2d8);
        }
        Json::Value::~Value(&sourceGroupsValue);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
        ::~_Rb_tree(&languageDataMap._M_t);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&languages._M_t);
      }
      goto LAB_003cc100;
    }
  }
  Json::Value::Value(__return_storage_ptr__,nullValue);
LAB_003cc100:
  Json::Value::~Value(&ttl);
  pVVar14 = (Value *)&typeName.field_2;
  if ((Value *)typeName._M_dataplus._M_p != pVVar14) {
    operator_delete(typeName._M_dataplus._M_p,typeName.field_2._M_allocated_capacity + 1);
    pVVar14 = extraout_RAX;
  }
  return pVVar14;
}

Assistant:

static Json::Value DumpTarget(cmGeneratorTarget* target,
                              const std::string& config)
{
  cmLocalGenerator* lg = target->GetLocalGenerator();

  const cmStateEnums::TargetType type = target->GetType();
  const std::string typeName = cmState::GetTargetTypeName(type);

  Json::Value ttl = Json::arrayValue;
  ttl.append("EXECUTABLE");
  ttl.append("STATIC_LIBRARY");
  ttl.append("SHARED_LIBRARY");
  ttl.append("MODULE_LIBRARY");
  ttl.append("OBJECT_LIBRARY");
  ttl.append("UTILITY");
  ttl.append("INTERFACE_LIBRARY");

  if (!hasString(ttl, typeName) || target->IsImported()) {
    return Json::Value();
  }

  Json::Value result = Json::objectValue;
  result[kNAME_KEY] = target->GetName();
  result[kIS_GENERATOR_PROVIDED_KEY] =
    target->Target->GetIsGeneratorProvided();
  result[kTYPE_KEY] = typeName;
  result[kSOURCE_DIRECTORY_KEY] = lg->GetCurrentSourceDirectory();
  result[kBUILD_DIRECTORY_KEY] = lg->GetCurrentBinaryDirectory();

  if (type == cmStateEnums::INTERFACE_LIBRARY) {
    return result;
  }

  result[kFULL_NAME_KEY] = target->GetFullName(config);

  if (target->Target->GetHaveInstallRule()) {
    result[kHAS_INSTALL_RULE] = true;

    Json::Value installPaths = Json::arrayValue;
    auto targetGenerators = target->Makefile->GetInstallGenerators();
    for (auto installGenerator : targetGenerators) {
      auto installTargetGenerator =
        dynamic_cast<cmInstallTargetGenerator*>(installGenerator);
      if (installTargetGenerator != nullptr &&
          installTargetGenerator->GetTarget()->Target == target->Target) {
        auto dest = installTargetGenerator->GetDestination(config);

        std::string installPath;
        if (!dest.empty() && cmSystemTools::FileIsFullPath(dest)) {
          installPath = dest;
        } else {
          std::string installPrefix =
            target->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
          installPath = installPrefix + '/' + dest;
        }

        installPaths.append(installPath);
      }
    }

    result[kINSTALL_PATHS] = installPaths;
  }

  if (target->HaveWellDefinedOutputFiles()) {
    Json::Value artifacts = Json::arrayValue;
    artifacts.append(
      target->GetFullPath(config, cmStateEnums::RuntimeBinaryArtifact));
    if (target->IsDLLPlatform()) {
      artifacts.append(
        target->GetFullPath(config, cmStateEnums::ImportLibraryArtifact));
      const cmGeneratorTarget::OutputInfo* output =
        target->GetOutputInfo(config);
      if (output && !output->PdbDir.empty()) {
        artifacts.append(output->PdbDir + '/' + target->GetPDBName(config));
      }
    }
    result[kARTIFACTS_KEY] = artifacts;

    result[kLINKER_LANGUAGE_KEY] = target->GetLinkerLanguage(config);

    std::string linkLibs;
    std::string linkFlags;
    std::string linkLanguageFlags;
    std::string frameworkPath;
    std::string linkPath;
    cmLinkLineComputer linkLineComputer(lg,
                                        lg->GetStateSnapshot().GetDirectory());
    lg->GetTargetFlags(&linkLineComputer, config, linkLibs, linkLanguageFlags,
                       linkFlags, frameworkPath, linkPath, target);

    linkLibs = cmSystemTools::TrimWhitespace(linkLibs);
    linkFlags = cmSystemTools::TrimWhitespace(linkFlags);
    linkLanguageFlags = cmSystemTools::TrimWhitespace(linkLanguageFlags);
    frameworkPath = cmSystemTools::TrimWhitespace(frameworkPath);
    linkPath = cmSystemTools::TrimWhitespace(linkPath);

    if (!cmSystemTools::TrimWhitespace(linkLibs).empty()) {
      result[kLINK_LIBRARIES_KEY] = linkLibs;
    }
    if (!cmSystemTools::TrimWhitespace(linkFlags).empty()) {
      result[kLINK_FLAGS_KEY] = linkFlags;
    }
    if (!cmSystemTools::TrimWhitespace(linkLanguageFlags).empty()) {
      result[kLINK_LANGUAGE_FLAGS_KEY] = linkLanguageFlags;
    }
    if (!frameworkPath.empty()) {
      result[kFRAMEWORK_PATH_KEY] = frameworkPath;
    }
    if (!linkPath.empty()) {
      result[kLINK_PATH_KEY] = linkPath;
    }
    const std::string sysroot =
      lg->GetMakefile()->GetSafeDefinition("CMAKE_SYSROOT");
    if (!sysroot.empty()) {
      result[kSYSROOT_KEY] = sysroot;
    }
  }

  std::set<std::string> languages;
  target->GetLanguages(languages, config);
  std::map<std::string, LanguageData> languageDataMap;

  for (std::string const& lang : languages) {
    LanguageData& ld = languageDataMap[lang];
    ld.Language = lang;
    lg->GetTargetCompileFlags(target, config, lang, ld.Flags);
    std::set<std::string> defines;
    lg->GetTargetDefines(target, config, lang, defines);
    ld.SetDefines(defines);
    std::vector<std::string> includePathList;
    lg->GetIncludeDirectories(includePathList, target, lang, config);
    for (std::string const& i : includePathList) {
      ld.IncludePathList.emplace_back(
        i, target->IsSystemIncludeDirectory(i, config, lang));
    }
  }

  Json::Value sourceGroupsValue =
    DumpSourceFilesList(target, config, languageDataMap);
  if (!sourceGroupsValue.empty()) {
    result[kFILE_GROUPS_KEY] = sourceGroupsValue;
  }

  return result;
}